

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KBO.cpp
# Opt level: O0

void __thiscall Kernel::KBO::State::traverse<_1,false>(State *this,KBO *kbo,AppliedTerm tt)

{
  TermList t_00;
  AppliedTerm parent;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  bool bVar3;
  int iVar4;
  uint uVar5;
  Term *pTVar6;
  AppliedTerm *in_RSI;
  int *in_RDI;
  AppliedTerm t;
  State *curr;
  TermList *in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff08;
  KBO *pKVar7;
  State *in_stack_ffffffffffffff10;
  State *this_00;
  AppliedTerm *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  uint uVar8;
  undefined8 in_stack_ffffffffffffff28;
  AppliedTerm *pAVar9;
  TermList *this_01;
  TermList in_stack_ffffffffffffff40;
  uint uStack_a4;
  TermList local_80;
  Stack<State> *local_78;
  State local_68;
  State *local_48;
  uint64_t local_40;
  Term *local_38;
  KBO *local_30;
  undefined4 local_28;
  uint uStack_24;
  AppliedTerm *local_10;
  
  this_01 = (TermList *)&stack0x00000008;
  local_10 = in_RSI;
  bVar3 = TermList::isVar(in_stack_ffffffffffffff00);
  if (bVar3) {
    *in_RDI = *in_RDI - *(int *)((long)&local_10[6].term._content + 4);
    TermList::var(this_01);
    recordVariable<_1>(in_stack_ffffffffffffff10,(uint)(in_stack_ffffffffffffff08 >> 0x20));
  }
  else {
    if ((traverse<-1,false>(Kernel::KBO_const&,Kernel::AppliedTerm)::recState == '\0') &&
       (iVar4 = __cxa_guard_acquire(&traverse<-1,false>(Kernel::KBO_const&,Kernel::AppliedTerm)::
                                     recState), iVar4 != 0)) {
      Lib::Stack<State>::Stack((Stack<State> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      __cxa_atexit(Lib::Stack<State>::~Stack,&traverse<-1,_false>::recState,&__dso_handle);
      __cxa_guard_release(&traverse<-1,false>(Kernel::KBO_const&,Kernel::AppliedTerm)::recState);
    }
    local_40 = this_01->_content;
    pTVar6 = (Term *)this_01[1]._content;
    pKVar7 = (KBO *)this_01[2]._content;
    local_28 = 0;
    this_00 = (State *)((ulong)uStack_24 << 0x20);
    auVar1._4_8_ = in_stack_ffffffffffffff18;
    auVar1._0_4_ = uStack_24;
    auVar1._12_4_ = in_stack_ffffffffffffff20;
    auVar1._16_4_ = in_stack_ffffffffffffff24;
    auVar1._20_8_ = in_stack_ffffffffffffff28;
    auVar1._28_4_ = 0;
    local_38 = pTVar6;
    local_30 = pKVar7;
    Lib::Stack<State>::push((Stack<State> *)pTVar6,(State)(auVar1 << 0x20));
    pAVar9 = local_10;
    TermList::term((TermList *)0x888854);
    iVar4 = symbolWeight(pKVar7,pTVar6);
    *in_RDI = *in_RDI - iVar4;
    while (bVar3 = Lib::Stack<State>::isNonEmpty(&traverse<-1,_false>::recState), bVar3) {
      local_48 = Lib::Stack<State>::top(&traverse<-1,_false>::recState);
      uVar8 = local_48->arg;
      pTVar6 = TermList::term((TermList *)0x8888b4);
      uVar5 = Term::arity(pTVar6);
      if (uVar8 < uVar5) {
        pTVar6 = TermList::term((TermList *)0x88890e);
        uVar5 = local_48->arg;
        local_48->arg = uVar5 + 1;
        Term::nthArgument(pTVar6,uVar5);
        pTVar6 = *(Term **)&(local_48->t).aboveVar;
        pKVar7 = (KBO *)(local_48->t).applicator;
        t_00._content._4_4_ = uVar8;
        t_00._content._0_4_ = in_stack_ffffffffffffff20;
        parent._8_8_ = in_RDI;
        parent.term._content = (uint64_t)this_01;
        parent.applicator = (SubstApplicator *)in_stack_ffffffffffffff40._content;
        AppliedTerm::AppliedTerm(in_stack_ffffffffffffff18,t_00,parent);
        bVar3 = TermList::isVar((TermList *)pTVar6);
        if (bVar3) {
          *in_RDI = *in_RDI - *(int *)((long)&local_10[6].term._content + 4);
          TermList::var(&local_80);
          recordVariable<_1>(this_00,(uint)((ulong)pKVar7 >> 0x20));
        }
        else {
          in_stack_ffffffffffffff18 = local_10;
          TermList::term((TermList *)0x8889ec);
          iVar4 = symbolWeight(pKVar7,pTVar6);
          *in_RDI = *in_RDI - iVar4;
          this_00 = (State *)((ulong)uStack_a4 << 0x20);
          auVar2._4_8_ = in_stack_ffffffffffffff18;
          auVar2._0_4_ = uStack_a4;
          auVar2._12_4_ = in_stack_ffffffffffffff20;
          auVar2._16_4_ = uVar8;
          auVar2._20_8_ = pAVar9;
          auVar2._28_4_ = 0;
          in_stack_ffffffffffffff40._content = local_80._content;
          Lib::Stack<State>::push(local_78,(State)(auVar2 << 0x20));
        }
      }
      else {
        Lib::Stack<State>::pop(&local_68,&traverse<-1,_false>::recState);
      }
    }
  }
  return;
}

Assistant:

void KBO::State::traverse(KBO const& kbo, AppliedTerm tt)
{
  static_assert(coef==1 || coef==-1);

  if (tt.term.isVar()) {
    if constexpr (!varsOnly) {
      _weightDiff += kbo._funcWeights._specialWeights._variableWeight * coef;
    }
    recordVariable<coef>(tt.term.var());
    return;
  }
  struct State {
    AppliedTerm t;
    unsigned arg;
  };
  static Stack<State> recState;
  recState.push(State{ tt, 0 });

  if constexpr (!varsOnly) {
    _weightDiff += kbo.symbolWeight(tt.term.term()) * coef;
  }

  while (recState.isNonEmpty()) {
    auto& curr = recState.top();
    if (curr.arg >= curr.t.term.term()->arity()) {
      recState.pop();
      continue;
    }
    AppliedTerm t(*curr.t.term.term()->nthArgument(curr.arg++), curr.t);
    if (t.term.isVar()) {
      ASS(!t.aboveVar);
      if constexpr (!varsOnly) {
        _weightDiff += kbo._funcWeights._specialWeights._variableWeight * coef;
      }
      recordVariable<coef>(t.term.var());
      continue;
    }

    if constexpr (varsOnly) {
      if (!t.term.term()->ground()) {
        recState.push(State{ t, 0 });
      }
    } else {
      _weightDiff += kbo.symbolWeight(t.term.term()) * coef;
      recState.push(State{ t, 0 });
    }
  }
}